

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float fVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar5;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar6;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar7;
  AccelData *pAVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  Primitive *prim;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  ulong uVar31;
  byte bVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_3;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vint4 bi_4;
  undefined1 auVar83 [16];
  vint4 ai_2;
  undefined1 auVar84 [16];
  vint4 bi_3;
  int in_XMM10_Da;
  int in_XMM10_Db;
  int in_XMM10_Dc;
  int in_XMM10_Dd;
  undefined1 auVar85 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar86 [64];
  int in_XMM12_Da;
  int in_XMM12_Db;
  int in_XMM12_Dc;
  int in_XMM12_Dd;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 in_ZMM31 [64];
  vint<4> octant;
  Precalculations pre;
  vbool<4>_conflict valid_leaf;
  uint uStack_1190;
  undefined1 auStack_1197 [15];
  undefined1 local_1188 [16];
  uint local_1138 [4];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar36 [16];
  undefined1 auVar69 [64];
  
  auVar42 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar33 = vpcmpeqd_avx512vl(auVar42,(undefined1  [16])valid_i->field_0);
  uVar33 = uVar33 & 0xf;
  if ((byte)uVar33 != 0) {
    pAVar8 = This->ptr;
    auVar41 = *(undefined1 (*) [16])(ray + 0x40);
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx(auVar41,auVar39);
    auVar78._8_4_ = 0x219392ef;
    auVar78._0_8_ = 0x219392ef219392ef;
    auVar78._12_4_ = 0x219392ef;
    uVar31 = vcmpps_avx512vl(auVar35,auVar78,1);
    auVar35 = vblendmps_avx512vl(auVar41,auVar78);
    bVar10 = (bool)((byte)uVar31 & 1);
    auVar40._0_4_ = (uint)bVar10 * auVar35._0_4_ | (uint)!bVar10 * in_XMM10_Da;
    bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * in_XMM10_Db;
    bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * in_XMM10_Dc;
    bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * in_XMM10_Dd;
    auVar35 = *(undefined1 (*) [16])(ray + 0x50);
    auVar36 = vandps_avx(auVar35,auVar39);
    uVar31 = vcmpps_avx512vl(auVar36,auVar78,1);
    auVar36 = vblendmps_avx512vl(auVar35,auVar78);
    bVar10 = (bool)((byte)uVar31 & 1);
    auVar37._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * in_XMM11_Da;
    bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar37._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * in_XMM11_Db;
    bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar37._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * in_XMM11_Dc;
    bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar37._12_4_ = (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * in_XMM11_Dd;
    auVar36 = *(undefined1 (*) [16])(ray + 0x60);
    auVar38 = vandps_avx(auVar36,auVar39);
    uVar31 = vcmpps_avx512vl(auVar38,auVar78,1);
    auVar38 = vblendmps_avx512vl(auVar36,auVar78);
    bVar10 = (bool)((byte)uVar31 & 1);
    auVar58._0_4_ = (uint)bVar10 * auVar38._0_4_ | (uint)!bVar10 * in_XMM12_Da;
    bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar58._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * in_XMM12_Db;
    bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar58._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * in_XMM12_Dc;
    bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar58._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * in_XMM12_Dd;
    auVar39 = vrcp14ps_avx512vl(auVar40);
    auVar78 = ZEXT816(0) << 0x40;
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_fma(auVar40,auVar39,auVar79);
    local_1088 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
    auVar85 = ZEXT1664(local_1088);
    auVar40 = vrcp14ps_avx512vl(auVar37);
    auVar38 = vfnmadd213ps_fma(auVar37,auVar40,auVar79);
    local_1098 = vfmadd132ps_fma(auVar38,auVar40,auVar40);
    auVar86 = ZEXT1664(local_1098);
    auVar40 = vrcp14ps_avx512vl(auVar58);
    auVar38 = vfnmadd213ps_fma(auVar58,auVar40,auVar79);
    local_10a8 = vfmadd132ps_fma(auVar38,auVar40,auVar40);
    auVar87 = ZEXT1664(local_10a8);
    local_1118 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar78);
    auVar41 = vcmpps_avx(auVar41,auVar78,1);
    auVar38._8_4_ = 1;
    auVar38._0_8_ = 0x100000001;
    auVar38._12_4_ = 1;
    auVar38 = vandps_avx512vl(auVar41,auVar38);
    uVar31 = vcmpps_avx512vl(auVar35,auVar78,1);
    auVar75._8_4_ = 2;
    auVar75._0_8_ = 0x200000002;
    auVar75._12_4_ = 2;
    auVar41 = vpsubd_avx512vl(auVar75,auVar41);
    bVar10 = (bool)((byte)uVar31 & 1);
    auVar35._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar38._0_4_;
    bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar35._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar38._4_4_;
    bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar35._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar38._8_4_;
    bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar35._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar38._12_4_;
    uVar31 = vcmpps_avx512vl(auVar36,auVar78,1);
    auVar41._8_4_ = 4;
    auVar41._0_8_ = 0x400000004;
    auVar41._12_4_ = 4;
    auVar41 = vpord_avx512vl(auVar35,auVar41);
    bVar10 = (bool)((byte)uVar31 & 1);
    auVar36._0_4_ = (uint)bVar10 * auVar41._0_4_ | !bVar10 * auVar35._0_4_;
    bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar10 * auVar41._4_4_ | !bVar10 * auVar35._4_4_;
    bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar10 * auVar41._8_4_ | !bVar10 * auVar35._8_4_;
    bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar10 * auVar41._12_4_ | !bVar10 * auVar35._12_4_;
    local_1128 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar78);
    auVar41 = vmovdqa32_avx512vl(auVar36);
    bVar10 = (bool)((byte)uVar33 & 1);
    bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
    bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
    bVar14 = SUB81(uVar33 >> 3,0);
    local_1138[0] = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar42._0_4_;
    local_1138[1] = (uint)bVar11 * auVar41._4_4_ | (uint)!bVar11 * auVar42._4_4_;
    local_1138[2] = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar42._8_4_;
    local_1138[3] = (uint)bVar14 * auVar41._12_4_ | (uint)!bVar14 * auVar42._12_4_;
    local_10e8 = *(float *)ray;
    fStack_10e4 = *(float *)(ray + 4);
    fStack_10e0 = *(float *)(ray + 8);
    fStack_10dc = *(float *)(ray + 0xc);
    local_10b8._0_4_ = local_1088._0_4_ * -*(float *)ray;
    local_10b8._4_4_ = local_1088._4_4_ * -*(float *)(ray + 4);
    local_10b8._8_4_ = local_1088._8_4_ * -*(float *)(ray + 8);
    local_10b8._12_4_ = local_1088._12_4_ * -*(float *)(ray + 0xc);
    auVar88 = ZEXT1664(local_10b8);
    local_10f8 = *(float *)(ray + 0x10);
    fStack_10f4 = *(float *)(ray + 0x14);
    fStack_10f0 = *(float *)(ray + 0x18);
    fStack_10ec = *(float *)(ray + 0x1c);
    local_10c8._0_4_ = local_1098._0_4_ * -*(float *)(ray + 0x10);
    local_10c8._4_4_ = local_1098._4_4_ * -*(float *)(ray + 0x14);
    local_10c8._8_4_ = local_1098._8_4_ * -*(float *)(ray + 0x18);
    local_10c8._12_4_ = local_1098._12_4_ * -*(float *)(ray + 0x1c);
    auVar89 = ZEXT1664(local_10c8);
    local_1108 = *(float *)(ray + 0x20);
    fStack_1104 = *(float *)(ray + 0x24);
    fStack_1100 = *(float *)(ray + 0x28);
    fStack_10fc = *(float *)(ray + 0x2c);
    local_10d8._0_4_ = local_10a8._0_4_ * -*(float *)(ray + 0x20);
    local_10d8._4_4_ = local_10a8._4_4_ * -*(float *)(ray + 0x24);
    local_10d8._8_4_ = local_10a8._8_4_ * -*(float *)(ray + 0x28);
    local_10d8._12_4_ = local_10a8._12_4_ * -*(float *)(ray + 0x2c);
    auVar90 = ZEXT1664(local_10d8);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar91 = ZEXT1664(auVar42);
    do {
      lVar22 = 0;
      for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar24 = local_1138[lVar22];
      auVar63._4_4_ = uVar24;
      auVar63._0_4_ = uVar24;
      auVar63._8_4_ = uVar24;
      auVar63._12_4_ = uVar24;
      auVar42._4_4_ = local_1138[1];
      auVar42._0_4_ = local_1138[0];
      auVar42._8_4_ = local_1138[2];
      auVar42._12_4_ = local_1138[3];
      uVar34 = vpcmpeqd_avx512vl(auVar63,auVar42);
      uVar34 = uVar34 & 0xf;
      bVar32 = (byte)uVar34;
      uVar33 = (long)(char)~bVar32 & uVar33;
      auVar21._4_4_ = fStack_10e4;
      auVar21._0_4_ = local_10e8;
      auVar21._8_4_ = fStack_10e0;
      auVar21._12_4_ = fStack_10dc;
      auVar37 = auVar91._0_16_;
      auVar42 = vblendmps_avx512vl(auVar37,auVar21);
      auVar43._0_4_ = (uint)(bVar32 & 1) * auVar42._0_4_ | !(bool)(bVar32 & 1) * uVar24;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar10 * auVar42._4_4_ | !bVar10 * uVar24;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar10 * auVar42._8_4_ | !bVar10 * uVar24;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar43._12_4_ = (uint)bVar10 * auVar42._12_4_ | !bVar10 * uVar24;
      auVar42 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar42 = vminps_avx(auVar42,auVar43);
      auVar41 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vminps_avx(auVar41,auVar42);
      auVar20._4_4_ = fStack_10f4;
      auVar20._0_4_ = local_10f8;
      auVar20._8_4_ = fStack_10f0;
      auVar20._12_4_ = fStack_10ec;
      auVar35 = vblendmps_avx512vl(auVar37,auVar20);
      auVar44._0_4_ = (uint)(bVar32 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar41._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * auVar41._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * auVar41._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar44._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * auVar41._12_4_;
      auVar41 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar41 = vminps_avx(auVar41,auVar44);
      auVar35 = vshufpd_avx(auVar41,auVar41,1);
      auVar41 = vminps_avx(auVar35,auVar41);
      auVar42 = vinsertps_avx(auVar42,auVar41,0x1c);
      auVar19._4_4_ = fStack_1104;
      auVar19._0_4_ = local_1108;
      auVar19._8_4_ = fStack_1100;
      auVar19._12_4_ = fStack_10fc;
      auVar35 = vblendmps_avx512vl(auVar37,auVar19);
      auVar45._0_4_ = (uint)(bVar32 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar41._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * auVar41._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * auVar41._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar45._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * auVar41._12_4_;
      auVar41 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar41 = vminps_avx(auVar41,auVar45);
      auVar35 = vshufpd_avx(auVar41,auVar41,1);
      auVar41 = vminps_avx(auVar35,auVar41);
      auVar41 = vinsertps_avx(auVar42,auVar41,0x20);
      auVar84._8_4_ = 0xff800000;
      auVar84._0_8_ = 0xff800000ff800000;
      auVar84._12_4_ = 0xff800000;
      auVar35 = vblendmps_avx512vl(auVar84,auVar21);
      auVar46._0_4_ = (uint)(bVar32 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar42._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * auVar42._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * auVar42._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar46._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * auVar42._12_4_;
      auVar42 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar42 = vmaxps_avx(auVar42,auVar46);
      auVar35 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vmaxps_avx(auVar35,auVar42);
      auVar36 = vblendmps_avx512vl(auVar84,auVar20);
      auVar47._0_4_ = (uint)(bVar32 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar35._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar35._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar35._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar47._12_4_ = (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar35._12_4_;
      auVar35 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar35 = vmaxps_avx(auVar35,auVar47);
      auVar36 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vmaxps_avx(auVar36,auVar35);
      auVar42 = vinsertps_avx(auVar42,auVar35,0x1c);
      auVar36 = vblendmps_avx512vl(auVar84,auVar19);
      auVar48._0_4_ = (uint)(bVar32 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar35._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar35._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar35._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar48._12_4_ = (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar35._12_4_;
      auVar35 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar35 = vmaxps_avx(auVar35,auVar48);
      auVar36 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vmaxps_avx(auVar36,auVar35);
      auVar35 = vinsertps_avx(auVar42,auVar35,0x20);
      auVar36 = vblendmps_avx512vl(auVar37,auVar85._0_16_);
      auVar49._0_4_ = (uint)(bVar32 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar42._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar42._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar42._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar49._12_4_ = (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar42._12_4_;
      auVar42 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar42 = vminps_avx(auVar42,auVar49);
      auVar36 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vminps_avx(auVar36,auVar42);
      auVar38 = vblendmps_avx512vl(auVar37,auVar86._0_16_);
      auVar50._0_4_ = (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar36._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar36._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar36._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar50._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar36 = vminps_avx(auVar36,auVar50);
      auVar38 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar38,auVar36);
      auVar42 = vinsertps_avx(auVar42,auVar36,0x1c);
      auVar38 = vblendmps_avx512vl(auVar37,auVar87._0_16_);
      auVar51._0_4_ = (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar36._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar36._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar36._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar51._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar36 = vminps_avx(auVar36,auVar51);
      auVar38 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar38,auVar36);
      auVar42 = vinsertps_avx(auVar42,auVar36,0x20);
      auVar38 = vblendmps_avx512vl(auVar84,auVar85._0_16_);
      auVar52._0_4_ = (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar36._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar36._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar36._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar52._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar36 = vmaxps_avx(auVar36,auVar52);
      auVar38 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vmaxps_avx(auVar38,auVar36);
      auVar40 = vblendmps_avx512vl(auVar84,auVar86._0_16_);
      auVar53._0_4_ = (uint)(bVar32 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar38._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar10 * auVar40._4_4_ | (uint)!bVar10 * auVar38._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * auVar38._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar53._12_4_ = (uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * auVar38._12_4_;
      auVar38 = vshufps_avx(auVar53,auVar53,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar53);
      auVar40 = vshufpd_avx(auVar38,auVar38,1);
      auVar38 = vmaxps_avx(auVar40,auVar38);
      auVar36 = vinsertps_avx(auVar36,auVar38,0x1c);
      auVar40 = vblendmps_avx512vl(auVar84,auVar87._0_16_);
      auVar54._0_4_ = (uint)(bVar32 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar38._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar10 * auVar40._4_4_ | (uint)!bVar10 * auVar38._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * auVar38._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar54._12_4_ = (uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * auVar38._12_4_;
      auVar38 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar54);
      auVar40 = vshufpd_avx(auVar38,auVar38,1);
      auVar38 = vmaxps_avx(auVar40,auVar38);
      auVar38 = vinsertps_avx(auVar36,auVar38,0x20);
      auVar40 = vblendmps_avx512vl(auVar37,local_1118);
      auVar55._0_4_ = (uint)(bVar32 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar36._0_4_
      ;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar10 * auVar40._4_4_ | (uint)!bVar10 * auVar36._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * auVar36._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar55._12_4_ = (uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar55,auVar55,0xb1);
      auVar36 = vminps_avx(auVar36,auVar55);
      auVar40 = vblendmps_avx512vl(auVar84,local_1128);
      auVar56._0_4_ =
           (uint)(bVar32 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar32 & 1) * in_ZMM17._0_4_;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar10 * auVar40._4_4_ | (uint)!bVar10 * in_ZMM17._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * in_ZMM17._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar56._12_4_ = (uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * in_ZMM17._12_4_;
      in_ZMM17 = ZEXT1664(auVar56);
      auVar40 = vshufps_avx512vl(auVar56,auVar56,0xb1);
      auVar40 = vmaxps_avx512vl(auVar40,auVar56);
      auVar37 = vshufpd_avx(auVar40,auVar40,1);
      local_1188 = vmaxps_avx(auVar37,auVar40);
      uVar31 = vcmpps_avx512vl(auVar42,ZEXT816(0) << 0x20,5);
      auVar40 = vblendmps_avx512vl(auVar38,auVar42);
      bVar9 = (byte)uVar31;
      fVar1 = (float)((uint)(bVar9 & 1) * auVar40._0_4_);
      fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar40._4_4_);
      auVar57._4_4_ = fVar2;
      auVar57._0_4_ = fVar1;
      fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar40._8_4_);
      auVar57._8_4_ = fVar3;
      fVar4 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar40._12_4_);
      auVar57._12_4_ = fVar4;
      auVar58 = vblendmps_avx512vl(auVar41,auVar35);
      bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar31 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar31 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar31 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar40 = vmovshdup_avx(auVar57);
      uVar26 = (ulong)(auVar40._0_4_ < 0.0) << 4 | 0x20;
      auVar40 = vshufpd_avx(auVar57,auVar57,1);
      uVar23 = (ulong)(auVar40._0_4_ < 0.0) << 4 | 0x40;
      auVar59._0_4_ =
           (float)((uint)(bVar9 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar42._0_4_);
      bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar59._4_4_ = (float)((uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * auVar42._4_4_);
      bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar59._8_4_ = (float)((uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * auVar42._8_4_);
      bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar59._12_4_ = (float)((uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * auVar42._12_4_);
      auVar72._0_4_ =
           (float)((uint)(bVar9 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar37._0_4_) *
           fVar1;
      auVar72._4_4_ = (float)((uint)bVar10 * auVar58._4_4_ | (uint)!bVar10 * auVar37._4_4_) * fVar2;
      auVar72._8_4_ = (float)((uint)bVar14 * auVar58._8_4_ | (uint)!bVar14 * auVar37._8_4_) * fVar3;
      auVar72._12_4_ =
           (float)((uint)bVar15 * auVar58._12_4_ | (uint)!bVar15 * auVar37._12_4_) * fVar4;
      auVar67._0_4_ =
           (float)((uint)(bVar9 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar35._0_4_) *
           auVar59._0_4_;
      auVar67._4_4_ =
           (float)((uint)bVar11 * auVar41._4_4_ | (uint)!bVar11 * auVar35._4_4_) * auVar59._4_4_;
      auVar67._8_4_ =
           (float)((uint)bVar13 * auVar41._8_4_ | (uint)!bVar13 * auVar35._8_4_) * auVar59._8_4_;
      auVar67._12_4_ =
           (float)((uint)bVar16 * auVar41._12_4_ | (uint)!bVar16 * auVar35._12_4_) * auVar59._12_4_;
      uVar31 = (ulong)(fVar1 < 0.0) * 0x10;
      stack[0].ptr.ptr = *(size_t *)&pAVar8[1].bounds.bounds0.lower.field_0;
      stack[0].dist = 0;
      local_fa8 = vbroadcastss_avx512vl(auVar57);
      auVar92 = ZEXT1664(local_fa8);
      auVar76._4_4_ = auVar72._0_4_;
      auVar76._0_4_ = auVar72._0_4_;
      auVar76._8_4_ = auVar72._0_4_;
      auVar76._12_4_ = auVar72._0_4_;
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      local_fb8 = vxorps_avx512vl(auVar76,auVar81);
      auVar93 = ZEXT1664(local_fb8);
      local_fc8 = vshufps_avx512vl(auVar57,auVar57,0x55);
      auVar94 = ZEXT1664(local_fc8);
      auVar42 = vshufps_avx(auVar72,auVar72,0x55);
      local_fd8 = vxorps_avx512vl(auVar42,auVar81);
      auVar95 = ZEXT1664(local_fd8);
      local_fe8 = vshufps_avx512vl(auVar57,auVar57,0xaa);
      auVar96 = ZEXT1664(local_fe8);
      auVar42 = vshufps_avx(auVar72,auVar72,0xaa);
      local_ff8 = vxorps_avx512vl(auVar42,auVar81);
      auVar97 = ZEXT1664(local_ff8);
      local_1008 = vbroadcastss_avx512vl(auVar59);
      auVar98 = ZEXT1664(local_1008);
      auVar73._4_4_ = auVar67._0_4_;
      auVar73._0_4_ = auVar67._0_4_;
      auVar73._8_4_ = auVar67._0_4_;
      auVar73._12_4_ = auVar67._0_4_;
      local_1018 = vxorps_avx512vl(auVar73,auVar81);
      auVar99 = ZEXT1664(local_1018);
      local_1028 = vshufps_avx512vl(auVar59,auVar59,0x55);
      auVar100 = ZEXT1664(local_1028);
      auVar42 = vshufps_avx(auVar67,auVar67,0x55);
      local_1038 = vxorps_avx512vl(auVar42,auVar81);
      auVar101 = ZEXT1664(local_1038);
      local_1048 = vshufps_avx512vl(auVar59,auVar59,0xaa);
      auVar102 = ZEXT1664(local_1048);
      auVar42 = vshufps_avx(auVar67,auVar67,0xaa);
      local_1058 = vxorps_avx512vl(auVar42,auVar81);
      auVar103 = ZEXT1664(local_1058);
      uVar62 = auVar36._0_4_;
      auVar64._4_4_ = uVar62;
      auVar64._0_4_ = uVar62;
      auVar64._8_4_ = uVar62;
      auVar64._12_4_ = uVar62;
      auVar42 = vshufps_avx(auVar36,auVar36,0xaa);
      local_1068 = vminps_avx512vl(auVar42,auVar64);
      auVar104 = ZEXT1664(local_1068);
      auVar65._8_4_ = 0x7f800000;
      auVar65._0_8_ = 0x7f8000007f800000;
      auVar65._12_4_ = 0x7f800000;
      auVar42 = vpblendmd_avx512vl(auVar65,local_1118);
      auVar60._0_4_ =
           (uint)(bVar32 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar32 & 1) * in_ZMM31._0_4_;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * in_ZMM31._4_4_;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * in_ZMM31._8_4_;
      bVar10 = SUB81(uVar34 >> 3,0);
      auVar60._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * in_ZMM31._12_4_;
      in_ZMM31 = ZEXT1664(auVar60);
      uVar62 = local_1188._0_4_;
      auVar66 = ZEXT1664(CONCAT412(uVar62,CONCAT48(uVar62,CONCAT44(uVar62,uVar62))));
      pSVar30 = stack + 1;
      local_1078 = vmovdqa64_avx512vl(auVar60);
      do {
        uVar24 = pSVar30[-1].dist;
        auVar68._4_4_ = uVar24;
        auVar68._0_4_ = uVar24;
        auVar68._8_4_ = uVar24;
        auVar68._12_4_ = uVar24;
        auVar69 = ZEXT1664(auVar68);
        pSVar30 = pSVar30 + -1;
        auVar42 = in_ZMM17._0_16_;
        uVar17 = vcmpps_avx512vl(auVar68,auVar42,1);
        if ((char)uVar17 != '\0') {
          sVar27 = (pSVar30->ptr).ptr;
          while ((sVar27 & 8) == 0) {
            auVar41 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + uVar31),auVar93._0_16_,
                                 auVar92._0_16_);
            auVar35 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + uVar26),auVar95._0_16_,
                                 auVar94._0_16_);
            auVar41 = vpmaxsd_avx(auVar41,auVar35);
            auVar35 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + uVar23),auVar97._0_16_,
                                 auVar96._0_16_);
            auVar35 = vpmaxsd_avx512vl(auVar35,auVar104._0_16_);
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vpmaxsd_avx(auVar41,auVar35);
            auVar41 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar31 ^ 0x10)),
                                 auVar99._0_16_,auVar98._0_16_);
            auVar35 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar26 ^ 0x10)),
                                 auVar101._0_16_,auVar100._0_16_);
            auVar41 = vpminsd_avx(auVar41,auVar35);
            auVar35 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar23 ^ 0x10)),
                                 auVar103._0_16_,auVar102._0_16_);
            auVar35 = vpminsd_avx(auVar35,auVar66._0_16_);
            auVar41 = vpminsd_avx(auVar41,auVar35);
            uVar34 = vcmpps_avx512vl((undefined1  [16])fmin.field_0,auVar41,2);
            if ((char)uVar34 == '\0') goto LAB_006f2950;
            auVar69 = ZEXT1664(auVar91._0_16_);
            uVar25 = 0;
            sVar28 = 8;
            do {
              lVar22 = 0;
              for (uVar18 = uVar34; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar62 = *(undefined4 *)(sVar27 + 0x20 + lVar22 * 4);
              auVar70._4_4_ = uVar62;
              auVar70._0_4_ = uVar62;
              auVar70._8_4_ = uVar62;
              auVar70._12_4_ = uVar62;
              auVar36 = vfmadd132ps_fma(auVar70,auVar88._0_16_,auVar85._0_16_);
              uVar62 = *(undefined4 *)(sVar27 + 0x40 + lVar22 * 4);
              auVar74._4_4_ = uVar62;
              auVar74._0_4_ = uVar62;
              auVar74._8_4_ = uVar62;
              auVar74._12_4_ = uVar62;
              auVar38 = vfmadd132ps_fma(auVar74,auVar89._0_16_,auVar86._0_16_);
              uVar62 = *(undefined4 *)(sVar27 + 0x60 + lVar22 * 4);
              auVar77._4_4_ = uVar62;
              auVar77._0_4_ = uVar62;
              auVar77._8_4_ = uVar62;
              auVar77._12_4_ = uVar62;
              auVar40 = vfmadd132ps_fma(auVar77,auVar90._0_16_,auVar87._0_16_);
              uVar62 = *(undefined4 *)(sVar27 + 0x30 + lVar22 * 4);
              auVar80._4_4_ = uVar62;
              auVar80._0_4_ = uVar62;
              auVar80._8_4_ = uVar62;
              auVar80._12_4_ = uVar62;
              auVar37 = vfmadd132ps_fma(auVar80,auVar88._0_16_,auVar85._0_16_);
              uVar62 = *(undefined4 *)(sVar27 + 0x50 + lVar22 * 4);
              auVar82._4_4_ = uVar62;
              auVar82._0_4_ = uVar62;
              auVar82._8_4_ = uVar62;
              auVar82._12_4_ = uVar62;
              auVar58 = vfmadd132ps_fma(auVar82,auVar89._0_16_,auVar86._0_16_);
              uVar62 = *(undefined4 *)(sVar27 + 0x70 + lVar22 * 4);
              auVar83._4_4_ = uVar62;
              auVar83._0_4_ = uVar62;
              auVar83._8_4_ = uVar62;
              auVar83._12_4_ = uVar62;
              auVar39 = vfmadd132ps_fma(auVar83,auVar90._0_16_,auVar87._0_16_);
              auVar41 = vpminsd_avx(auVar36,auVar37);
              auVar35 = vpminsd_avx(auVar38,auVar58);
              auVar41 = vpmaxsd_avx(auVar41,auVar35);
              auVar35 = vpminsd_avx(auVar40,auVar39);
              auVar35 = vpmaxsd_avx512vl(auVar35,in_ZMM31._0_16_);
              auVar41 = vpmaxsd_avx(auVar41,auVar35);
              auVar35 = vpmaxsd_avx(auVar36,auVar37);
              auVar36 = vpmaxsd_avx(auVar38,auVar58);
              auVar36 = vpminsd_avx(auVar35,auVar36);
              auVar35 = vpmaxsd_avx(auVar40,auVar39);
              auVar35 = vpminsd_avx512vl(auVar35,auVar42);
              auVar35 = vpminsd_avx(auVar36,auVar35);
              uVar18 = vpcmpd_avx512vl(auVar41,auVar35,2);
              sVar29 = sVar28;
              if ((uVar18 & 0xf) != 0) {
                uVar62 = *(undefined4 *)((long)&stack[-1].ptr.ptr + lVar22 * 4);
                auVar71._4_4_ = uVar62;
                auVar71._0_4_ = uVar62;
                auVar71._8_4_ = uVar62;
                auVar71._12_4_ = uVar62;
                sVar29 = *(size_t *)(sVar27 + lVar22 * 8);
                auVar41 = auVar69._0_16_;
                uVar17 = vcmpps_avx512vl(auVar71,auVar41,1);
                if ((char)uVar17 == '\0') {
                  (pSVar30->ptr).ptr = sVar29;
                  sVar29 = sVar28;
                }
                else {
                  if (sVar28 == 8) {
                    auVar69 = ZEXT1664(auVar71);
                    goto LAB_006f2700;
                  }
                  (pSVar30->ptr).ptr = sVar28;
                  auVar69 = ZEXT1664(auVar71);
                  auVar71 = auVar41;
                }
                uVar25 = uVar25 + 1;
                pSVar30->dist = auVar71._0_4_;
                pSVar30 = pSVar30 + 1;
              }
LAB_006f2700:
              uVar34 = uVar34 - 1 & uVar34;
              sVar28 = sVar29;
            } while (uVar34 != 0);
            if (sVar29 == 8) goto LAB_006f2950;
            sVar27 = sVar29;
            if (1 < uVar25) {
              pSVar5 = pSVar30 + -2;
              pSVar6 = pSVar30 + -1;
              if (pSVar30[-2].dist < pSVar30[-1].dist) {
                _valid_leaf = *pSVar5;
                pSVar30[-2].dist = pSVar30[-1].dist;
                (pSVar5->ptr).ptr = (pSVar6->ptr).ptr;
                (pSVar6->ptr).ptr = _valid_leaf;
                pSVar30[-1].dist = uStack_1190;
              }
              if (uVar25 != 2) {
                pSVar7 = pSVar30 + -3;
                uVar24 = pSVar30[-3].dist;
                if (uVar24 < pSVar30[-1].dist) {
                  _valid_leaf = *pSVar7;
                  pSVar30[-3].dist = pSVar30[-1].dist;
                  (pSVar7->ptr).ptr = (pSVar6->ptr).ptr;
                  (pSVar6->ptr).ptr = _valid_leaf;
                  pSVar30[-1].dist = uStack_1190;
                  uVar24 = pSVar30[-3].dist;
                }
                if (uVar24 < pSVar30[-2].dist) {
                  _valid_leaf = *pSVar7;
                  pSVar30[-3].dist = pSVar30[-2].dist;
                  (pSVar7->ptr).ptr = (pSVar5->ptr).ptr;
                  (pSVar5->ptr).ptr = _valid_leaf;
                  pSVar30[-2].dist = uStack_1190;
                }
              }
            }
          }
          uVar17 = vcmpps_avx512vl(auVar42,auVar69._0_16_,6);
          uVar24 = (uint)uVar17;
          valid_leaf.v = (char)uVar17;
          if ((char)uVar17 != '\0') {
            lVar22 = (ulong)((uint)sVar27 & 0xf) - 8;
            if (lVar22 != 0) {
              prim = (Primitive *)(sVar27 & 0xfffffffffffffff0);
              local_f98 = auVar42;
              do {
                InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                prim = prim + 1;
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
              uVar24 = (uint)valid_leaf.v;
              auVar85 = ZEXT1664(local_1088);
              auVar86 = ZEXT1664(local_1098);
              auVar87 = ZEXT1664(local_10a8);
              auVar88 = ZEXT1664(local_10b8);
              auVar89 = ZEXT1664(local_10c8);
              auVar90 = ZEXT1664(local_10d8);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar91 = ZEXT1664(auVar42);
              in_ZMM17 = ZEXT1664(local_f98);
              auVar92 = ZEXT1664(local_fa8);
              auVar93 = ZEXT1664(local_fb8);
              auVar94 = ZEXT1664(local_fc8);
              auVar95 = ZEXT1664(local_fd8);
              auVar96 = ZEXT1664(local_fe8);
              auVar97 = ZEXT1664(local_ff8);
              auVar98 = ZEXT1664(local_1008);
              auVar99 = ZEXT1664(local_1018);
              auVar100 = ZEXT1664(local_1028);
              auVar101 = ZEXT1664(local_1038);
              auVar102 = ZEXT1664(local_1048);
              auVar103 = ZEXT1664(local_1058);
              auVar104 = ZEXT1664(local_1068);
              auVar42 = vmovdqa64_avx512vl(local_1078);
              in_ZMM31 = ZEXT1664(auVar42);
            }
            auVar42 = *(undefined1 (*) [16])(ray + 0x80);
            uVar17 = vcmpps_avx512vl(auVar42,in_ZMM17._0_16_,1);
            if ((byte)((byte)uVar24 & (byte)uVar17) != 0) {
              bVar10 = (bool)((byte)uVar24 & 1);
              auVar61._0_4_ = (uint)bVar10 * auVar42._0_4_ | (uint)!bVar10 * in_ZMM17._0_4_;
              bVar10 = (bool)((byte)(uVar24 >> 1) & 1);
              auVar61._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * in_ZMM17._4_4_;
              bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
              auVar61._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * in_ZMM17._8_4_;
              bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar61._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * in_ZMM17._12_4_;
              in_ZMM17 = ZEXT1664(auVar61);
              auVar42 = vshufps_avx512vl(auVar61,auVar61,0xb1);
              auVar41 = vmaxps_avx512vl(auVar42,auVar61);
              auVar42 = vshufpd_avx(auVar41,auVar41,1);
              local_1188 = vmaxss_avx(auVar42,auVar41);
            }
          }
        }
        uVar62 = local_1188._0_4_;
        auVar66 = ZEXT1664(CONCAT412(uVar62,CONCAT48(uVar62,CONCAT44(uVar62,uVar62))));
LAB_006f2950:
      } while (pSVar30 != stack);
    } while (uVar33 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_EQ); }